

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoding_backend_init_memory__mp3
                    (void *pUserData,void *pData,size_t dataSize,ma_decoding_backend_config *pConfig
                    ,ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_decoding_backend_config pMP3_00;
  void *in_RCX;
  size_t in_R8;
  ma_decoding_backend_config *in_R9;
  ma_mp3 *pMP3;
  ma_result result;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  pMP3_00 = (ma_decoding_backend_config)
            ma_malloc(in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x214901);
  if (pMP3_00 == (ma_decoding_backend_config)0x0) {
    local_4 = MA_OUT_OF_MEMORY;
  }
  else {
    local_4 = ma_mp3_init_memory(in_RCX,in_R8,in_R9,
                                 (ma_allocation_callbacks *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (ma_mp3 *)pMP3_00);
    if (local_4 == MA_SUCCESS) {
      *in_R9 = pMP3_00;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffc0),(ma_allocation_callbacks *)pMP3_00
             );
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoding_backend_init_memory__mp3(void* pUserData, const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_mp3* pMP3;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pMP3 = (ma_mp3*)ma_malloc(sizeof(*pMP3), pAllocationCallbacks);
    if (pMP3 == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_mp3_init_memory(pData, dataSize, pConfig, pAllocationCallbacks, pMP3);
    if (result != MA_SUCCESS) {
        ma_free(pMP3, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pMP3;

    return MA_SUCCESS;
}